

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

void __thiscall Population::evolve(Population *this)

{
  DNA *dna1;
  DNA *dna2;
  ulong uVar1;
  ulong uVar2;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  double dVar3;
  vector<DNA,_std::allocator<DNA>_> new_population;
  vector<DNA,_std::allocator<DNA>_> local_c8;
  undefined1 local_a8 [16];
  pointer local_98;
  DNA local_68;
  
  local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8._0_8_ =
       (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8._8_8_ =
       (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (local_a8._8_8_ != local_a8._0_8_) {
    uVar2 = 0;
    do {
      random_engine();
      dVar3 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&random_engine::smt);
      dna1 = GetDNAWithProbability(this,dVar3 + 0.0);
      random_engine();
      dVar3 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&random_engine::smt);
      dna2 = GetDNAWithProbability(this,dVar3 + 0.0);
      crossover(&local_68,this,dna1,dna2);
      mutation((DNA *)local_a8,this,&local_68);
      std::vector<DNA,_std::allocator<DNA>_>::emplace_back<DNA>(&local_c8,(DNA *)local_a8);
      std::
      _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
                   *)local_a8);
      std::
      _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
                   *)&local_68);
      uVar2 = uVar2 + 1;
      local_a8._0_8_ =
           (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a8._8_8_ =
           (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar1 = ((long)(local_a8._8_8_ - local_a8._0_8_) >> 3) * 0x6db6db6db6db6db7;
    } while (uVar2 <= uVar1 && uVar1 - uVar2 != 0);
  }
  local_98 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_start = local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
             _M_start;
  (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data
              ._M_finish;
  (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_c8.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<DNA,_std::allocator<DNA>_>::~vector((vector<DNA,_std::allocator<DNA>_> *)local_a8);
  calcFitness(this);
  std::vector<DNA,_std::allocator<DNA>_>::~vector(&local_c8);
  return;
}

Assistant:

void Population::evolve() {
    vector<DNA> new_population;

    for (int i = 0; i < population_.size(); ++i) {
        const DNA& dna1 = GetDNAWithProbability(RandomProbability());
        const DNA& dna2 = GetDNAWithProbability(RandomProbability());
        new_population.push_back(mutation(crossover(dna1, dna2)));
    }

    population_ = move(new_population);
    calcFitness();
}